

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O1

void __thiscall
COLLADASaxFWL::SceneLoader::SceneLoader(SceneLoader *this,IFilePartLoader *callingFilePartLoader)

{
  Scene *pSVar1;
  allocator_type local_35;
  equal_to<COLLADAFW::UniqueId> local_34;
  hash<COLLADAFW::UniqueId> local_33;
  _Identity<COLLADAFW::UniqueId> local_32;
  _Default_ranged_hash local_31;
  UniqueId local_30;
  
  FilePartLoader::FilePartLoader(&this->super_FilePartLoader,callingFilePartLoader);
  (this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__SceneLoader_00933630;
  pSVar1 = (Scene *)operator_new(0x30);
  IFilePartLoader::createUniqueId(&local_30,(IFilePartLoader *)this,SCENE);
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).super_Object._vptr_Object =
       (_func_int **)&PTR__ObjectTemplate_009337a8;
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).mUniqueId.mClassId =
       local_30.mClassId;
  *(undefined4 *)
   &(pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).mUniqueId.field_0x4 =
       local_30._4_4_;
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).mUniqueId.mObjectId =
       local_30.mObjectId;
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).mUniqueId.mFileId =
       local_30.mFileId;
  (pSVar1->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>).super_Object._vptr_Object =
       (_func_int **)&PTR__Scene_00933748;
  pSVar1->mInstanceVisualScene = (InstanceVisualScene *)0x0;
  pSVar1->mInstanceKinematicsScene = (InstanceKinematicsScene *)0x0;
  COLLADAFW::UniqueId::~UniqueId(&local_30);
  this->mCurrentScene = pSVar1;
  std::tr1::
  _Hashtable<COLLADAFW::UniqueId,_COLLADAFW::UniqueId,_std::allocator<COLLADAFW::UniqueId>,_std::_Identity<COLLADAFW::UniqueId>,_std::equal_to<COLLADAFW::UniqueId>,_std::tr1::hash<COLLADAFW::UniqueId>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
  ::_Hashtable((_Hashtable<COLLADAFW::UniqueId,_COLLADAFW::UniqueId,_std::allocator<COLLADAFW::UniqueId>,_std::_Identity<COLLADAFW::UniqueId>,_std::equal_to<COLLADAFW::UniqueId>,_std::tr1::hash<COLLADAFW::UniqueId>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                *)&this->mBoundNodes,10,&local_33,(_Mod_range_hashing *)&local_30,&local_31,
               &local_34,&local_32,&local_35);
  this->mCurrentInstanceKinematicsScene = (KinematicsInstanceKinematicsScene *)0x0;
  this->mCurrentBindJointAxis = (KinematicsBindJointAxis *)0x0;
  (this->mCurrentCharacterData)._M_dataplus._M_p = (pointer)&(this->mCurrentCharacterData).field_2;
  (this->mCurrentCharacterData)._M_string_length = 0;
  (this->mCurrentCharacterData).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SceneLoader::SceneLoader ( IFilePartLoader* callingFilePartLoader )
        : FilePartLoader(callingFilePartLoader)
        , mCurrentScene ( new COLLADAFW::Scene (createUniqueId(COLLADAFW::Scene::ID())) )
		, mCurrentInstanceKinematicsScene(0)
		, mCurrentBindJointAxis(0)
		, mCurrentCharacterData()
	{
	}